

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O2

void envy_bios_print_cinema(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar2 = (bios->cinema).offset;
  if ((mask >> 0x16 & 1) == 0 || uVar2 == 0) {
    return;
  }
  bVar1 = (bios->cinema).version;
  uVar3 = (ulong)(bVar1 >> 4);
  uVar4 = (ulong)(bVar1 & 0xf);
  if ((bios->cinema).valid != '\0') {
    fprintf((FILE *)out,"CINEMA table at 0x%04x version %d.%d data",(ulong)uVar2,uVar3,uVar4);
    for (lVar5 = 0x1cd; lVar5 != 0x1d7; lVar5 = lVar5 + 1) {
      fprintf((FILE *)out," 0x%02x",(ulong)*(byte *)((long)&bios->data + lVar5));
    }
    fputc(10,(FILE *)out);
    envy_bios_dump_hex(bios,out,(uint)(bios->cinema).offset,(uint)(bios->cinema).hlen,mask);
    fputc(10,(FILE *)out);
    return;
  }
  fprintf((FILE *)out,"Failed to parse CINEMA table at 0x%04x version %d.%d\n\n",(ulong)uVar2,uVar3,
          uVar4);
  return;
}

Assistant:

void envy_bios_print_cinema (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_cinema *cinema = &bios->cinema;
	if (!cinema->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!cinema->valid) {
		fprintf(out, "Failed to parse CINEMA table at 0x%04x version %d.%d\n\n", cinema->offset, cinema->version >> 4, cinema->version & 0xf);
		return;
	}
	fprintf(out, "CINEMA table at 0x%04x version %d.%d data", cinema->offset, cinema->version >> 4, cinema->version & 0xf);
	int i;
	for (i = 0; i < 10; i++)
		fprintf(out, " 0x%02x", cinema->unk02[i]);
	fprintf(out, "\n");
	envy_bios_dump_hex(bios, out, cinema->offset, cinema->hlen, mask);
	fprintf(out, "\n");
}